

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5calc.cpp
# Opt level: O3

void MD5_String2binary(char *string,uchar *output)

{
  uint *B2;
  uint *D2;
  ulong __n;
  byte *__s;
  uint *A;
  uint uVar1;
  uint msg_digest [4];
  undefined8 local_a8;
  undefined8 uStack_a0;
  size_t local_90;
  size_t local_88;
  uchar *local_80;
  byte local_78 [56];
  int local_40;
  int local_3c;
  
  B2 = (uint *)((long)&local_a8 + 4);
  D2 = (uint *)((long)&uStack_a0 + 4);
  local_a8 = 0xefcdab8967452301;
  uStack_a0 = 0x1032547698badcfe;
  local_80 = output;
  local_90 = strlen(string);
  local_88 = local_90;
  if (0x3f < (int)local_90) {
    uVar1 = (int)local_90 + 0x40;
    do {
      MD5_Round_Calculate((uchar *)string,(uint *)&local_a8,B2,(uint *)&uStack_a0,D2);
      string = (char *)((uchar *)string + 0x40);
      uVar1 = uVar1 - 0x40;
    } while (0x7f < uVar1);
  }
  uVar1 = (uint)local_90 & 0x3f;
  __n = (ulong)((uint)local_88 & 0x3f);
  strncpy((char *)local_78,string,__n);
  __s = local_78 + __n;
  memset(__s,0,(ulong)(0x40 - uVar1));
  *__s = *__s | 0x80;
  if (0x37 < uVar1) {
    MD5_Round_Calculate(local_78,(uint *)&local_a8,B2,(uint *)&uStack_a0,D2);
    local_78[0x20] = 0;
    local_78[0x21] = 0;
    local_78[0x22] = 0;
    local_78[0x23] = 0;
    local_78[0x24] = 0;
    local_78[0x25] = 0;
    local_78[0x26] = 0;
    local_78[0x27] = 0;
    local_78[0x28] = 0;
    local_78[0x29] = 0;
    local_78[0x2a] = 0;
    local_78[0x2b] = 0;
    local_78[0x2c] = 0;
    local_78[0x2d] = 0;
    local_78[0x2e] = 0;
    local_78[0x2f] = 0;
    local_78[0x10] = 0;
    local_78[0x11] = 0;
    local_78[0x12] = 0;
    local_78[0x13] = 0;
    local_78[0x14] = 0;
    local_78[0x15] = 0;
    local_78[0x16] = 0;
    local_78[0x17] = 0;
    local_78[0x18] = 0;
    local_78[0x19] = 0;
    local_78[0x1a] = 0;
    local_78[0x1b] = 0;
    local_78[0x1c] = 0;
    local_78[0x1d] = 0;
    local_78[0x1e] = 0;
    local_78[0x1f] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[2] = 0;
    local_78[3] = 0;
    local_78[4] = 0;
    local_78[5] = 0;
    local_78[6] = 0;
    local_78[7] = 0;
    local_78[8] = 0;
    local_78[9] = 0;
    local_78[10] = 0;
    local_78[0xb] = 0;
    local_78[0xc] = 0;
    local_78[0xd] = 0;
    local_78[0xe] = 0;
    local_78[0xf] = 0;
    local_78[0x30] = 0;
    local_78[0x31] = 0;
    local_78[0x32] = 0;
    local_78[0x33] = 0;
    local_78[0x34] = 0;
    local_78[0x35] = 0;
    local_78[0x36] = 0;
    local_78[0x37] = 0;
  }
  uVar1 = (uint)local_90;
  local_40 = uVar1 * 8;
  local_3c = 0;
  if (0x1fffffff < uVar1) {
    local_3c = uVar1 * 8 + 8;
  }
  MD5_Round_Calculate(local_78,(uint *)&local_a8,B2,(uint *)&uStack_a0,D2);
  *(undefined8 *)local_80 = local_a8;
  *(undefined8 *)(local_80 + 8) = uStack_a0;
  return;
}

Assistant:

static void MD5_String2binary(const char * string, unsigned char * output)
{
//var
   /*8bit*/
   unsigned char padding_message[64]; //Extended message   512bit 64byte
   unsigned char *pstring;            //The position of string in the present scanning notes is held.

   /*32bit*/
   unsigned int string_byte_len,     //The byte chief of string is held.
                string_bit_len,      //The bit length of string is held.
                copy_len,            //The number of bytes which is used by 1-3 and which remained
                msg_digest[4];       //Message digest   128bit 4byte
   unsigned int *A = &msg_digest[0], //The message digest in accordance with RFC (reference)
                *B = &msg_digest[1],
                *C = &msg_digest[2],
                *D = &msg_digest[3];
	int i;

//prog
   //Step 3.Initialize MD Buffer (although it is the initialization; step 3 of A, B, C, and D -- unavoidable -- a head)
   *A = 0x67452301;
   *B = 0xefcdab89;
   *C = 0x98badcfe;
   *D = 0x10325476;

   //Step 1.Append Padding Bits (extension of a mark bit)
   //1-1
   string_byte_len = (unsigned int)strlen(string);    //The byte chief of a character sequence is acquired.
   pstring = (unsigned char *)string; //The position of the present character sequence is set.

   //1-2  Repeat calculation until length becomes less than 64 bytes.
   for (i=string_byte_len; 64<=i; i-=64,pstring+=64)
        MD5_Round_Calculate(pstring, A,B,C,D);

   //1-3
   copy_len = string_byte_len % 64;                               //The number of bytes which remained is computed.
   strncpy((char *)padding_message, (char *)pstring, copy_len); //A message is copied to an extended bit sequence.
   memset(padding_message+copy_len, 0, 64 - copy_len);           //It buries by 0 until it becomes extended bit length.
   padding_message[copy_len] |= 0x80;                            //The next of a message is 1.

   //1-4
   //If 56 bytes or more (less than 64 bytes) of remainder becomes, it will calculate by extending to 64 bytes.
   if (56 <= copy_len) {
       MD5_Round_Calculate(padding_message, A,B,C,D);
       memset(padding_message, 0, 56); //56 bytes is newly fill uped with 0.
   }

   //Step 2.Append Length (the information on length is added)
   string_bit_len = string_byte_len * 8;             //From the byte chief to bit length (32 bytes of low rank)
   memcpy(&padding_message[56], &string_bit_len, 4); //32 bytes of low rank is set.

   //When bit length cannot be expressed in 32 bytes of low rank, it is a beam raising to a higher rank.
  if (UINT_MAX / 8 < string_byte_len) {
      unsigned int high = (string_byte_len - UINT_MAX / 8) * 8;
      memcpy(&padding_message[60], &high, 4);
  } else
      memset(&padding_message[60], 0, 4); //In this case, it is good for a higher rank at 0.

   //Step 4.Process Message in 16-Word Blocks (calculation of MD5)
   MD5_Round_Calculate(padding_message, A,B,C,D);

   //Step 5.Output (output)
   memcpy(output,msg_digest,16);
}